

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::Reg1Unsigned1(ByteCodeWriter *this,OpCode op,RegSlot R0,uint C1)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot R0_00;
  undefined4 *puVar5;
  RegSlot local_3c;
  uint local_38;
  ProfileId local_34;
  OpCode local_32 [3];
  ProfileId profileId;
  OpCode op_local;
  
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,local_32[0],(OpLayoutType)0xa);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(local_32[0]);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x958,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_008a2f99;
    *puVar5 = 0;
  }
  if (R0 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar3) {
      *puVar5 = 0;
      Throw::InternalError();
    }
LAB_008a2f99:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (this->m_functionWrite == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar3) goto LAB_008a2f99;
    *puVar5 = 0;
  }
  R0_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
  local_34 = 0xffff;
  bVar3 = DoProfileNewScArrayOp(this,local_32[0]);
  if (bVar3) {
    bVar3 = DynamicProfileInfo::IsEnabled(NativeArrayPhase,this->m_functionWrite);
    if (bVar3) {
      TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
      if (TVar1 != 0xffff) {
        this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
        bVar3 = true;
        local_34 = TVar1;
        goto LAB_008a2eb2;
      }
    }
  }
  if (local_32[0] == InitForInEnumerator) {
    bVar3 = FunctionBody::AllocProfiledForInLoopCount(this->m_functionWrite,&local_34);
  }
  else {
    bVar3 = false;
  }
LAB_008a2eb2:
  if (bVar3 != false) {
    OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
  }
  bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,local_32[0],R0_00,C1);
  if (!bVar4) {
    bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,local_32[0],R0_00,C1);
    if (!bVar4) {
      local_3c = R0_00;
      local_38 = C1;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
      Data::Write(&this->m_byteCodeData,&local_3c,8);
    }
  }
  if (bVar3 != false) {
    Data::Write(&this->m_byteCodeData,&local_34,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg1Unsigned1(OpCode op, RegSlot R0, uint C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg1Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);

        ProfileId profileId = Constants::NoProfileId;
        bool isProfiled = (DoProfileNewScArrayOp(op) &&
            DoDynamicProfileOpcode(NativeArrayPhase, true) &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId))
            || (op == OpCode::InitForInEnumerator &&
                this->m_functionWrite->AllocProfiledForInLoopCount(&profileId));

        if (isProfiled)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        MULTISIZE_LAYOUT_WRITE(Reg1Unsigned1, op, R0, C1);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }